

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Tbc::Text::Text(Text *this,string *_str,TextAttributes *_attr)

{
  long *plVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  undefined3 uVar5;
  pointer pcVar6;
  undefined8 *puVar7;
  size_t sVar8;
  long lVar9;
  char cVar10;
  ulong uVar11;
  _Alloc_hider _pos;
  long lVar12;
  size_type *local_f8;
  string wrappableChars;
  long local_d0;
  ulong local_c8 [2];
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  long local_98;
  Text *local_90;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  undefined1 local_78 [8];
  string remainder;
  long local_48;
  undefined8 uStack_40;
  size_t local_38;
  
  local_80 = &(this->str).field_2;
  (this->str)._M_dataplus._M_p = (pointer)local_80;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  sVar8 = _attr->indent;
  sVar4 = _attr->width;
  uVar2 = *(undefined4 *)((long)&_attr->width + 4);
  cVar10 = _attr->tabChar;
  uVar5 = *(undefined3 *)&_attr->field_0x19;
  uVar3 = *(undefined4 *)&_attr->field_0x1c;
  (this->attr).initialIndent = _attr->initialIndent;
  (this->attr).indent = sVar8;
  *(int *)&(this->attr).width = (int)sVar4;
  *(undefined4 *)((long)&(this->attr).width + 4) = uVar2;
  (this->attr).tabChar = cVar10;
  *(undefined3 *)&(this->attr).field_0x19 = uVar5;
  *(undefined4 *)&(this->attr).field_0x1c = uVar3;
  local_88 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->lines;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8 = &wrappableChars._M_string_length;
  local_90 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8," [({.,/|\\-","");
  local_38 = _attr->initialIndent;
  if (local_38 == 0xffffffffffffffff) {
    local_38 = _attr->indent;
  }
  local_78 = (undefined1  [8])&remainder._M_string_length;
  pcVar6 = (_str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar6,pcVar6 + _str->_M_string_length);
  if (remainder._M_dataplus._M_p != (pointer)0x0) {
    do {
      if (0x7ce0 < (ulong)((long)(this->lines).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->lines).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
        remainder.field_2._8_8_ = &stack0xffffffffffffffb8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&remainder.field_2 + 8),
                   "... message truncated due to excessive size","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&remainder.field_2 + 8));
        if ((long *)remainder.field_2._8_8_ != &stack0xffffffffffffffb8) {
          operator_delete((void *)remainder.field_2._8_8_,local_48 + 1);
        }
        break;
      }
      _pos._M_p = (pointer)(_attr->width - local_38);
      if (remainder._M_dataplus._M_p <= _pos._M_p) {
        _pos._M_p = remainder._M_dataplus._M_p;
      }
      cVar10 = (char)(string *)local_78;
      pcVar6 = (pointer)std::__cxx11::string::find(cVar10,10);
      if (pcVar6 < _pos._M_p) {
        _pos._M_p = pcVar6;
      }
      local_98 = std::__cxx11::string::rfind(cVar10,(ulong)(uint)(int)_attr->tabChar);
      if (local_98 != -1) {
        cVar10 = *(char *)((long)local_78 + (long)_pos._M_p);
        std::__cxx11::string::substr((ulong)((long)&wrappableChars.field_2 + 8),(ulong)local_78);
        std::__cxx11::string::substr((ulong)&local_b8,(ulong)local_78);
        uVar11 = 0xf;
        if ((ulong *)wrappableChars.field_2._8_8_ != local_c8) {
          uVar11 = local_c8[0];
        }
        if (uVar11 < (ulong)(local_b0 + local_d0)) {
          uVar11 = 0xf;
          if (local_b8 != local_a8) {
            uVar11 = local_a8[0];
          }
          if (uVar11 < (ulong)(local_b0 + local_d0)) goto LAB_00157fe2;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_b8,0,(char *)0x0,wrappableChars.field_2._8_8_);
        }
        else {
LAB_00157fe2:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             (wrappableChars.field_2._M_local_buf + 8,(ulong)local_b8);
        }
        remainder.field_2._8_8_ = &stack0xffffffffffffffb8;
        plVar1 = puVar7 + 2;
        if ((long *)*puVar7 == plVar1) {
          local_48 = *plVar1;
          uStack_40 = puVar7[3];
        }
        else {
          local_48 = *plVar1;
          remainder.field_2._8_8_ = (long *)*puVar7;
        }
        *puVar7 = plVar1;
        puVar7[1] = 0;
        *(undefined1 *)plVar1 = 0;
        std::__cxx11::string::operator=
                  ((string *)local_78,(string *)(remainder.field_2._M_local_buf + 8));
        if ((long *)remainder.field_2._8_8_ != &stack0xffffffffffffffb8) {
          operator_delete((void *)remainder.field_2._8_8_,local_48 + 1);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8,local_a8[0] + 1);
        }
        if ((ulong *)wrappableChars.field_2._8_8_ != local_c8) {
          operator_delete((void *)wrappableChars.field_2._8_8_,local_c8[0] + 1);
        }
        _pos._M_p = _pos._M_p + -(ulong)(cVar10 == '\n');
        this = local_90;
      }
      if (_pos._M_p == remainder._M_dataplus._M_p) {
        spliceLine(this,local_38,(string *)local_78,(size_t)_pos._M_p);
      }
      else if (*(char *)((long)local_78 + (long)_pos._M_p) == '\n') {
        spliceLine(this,local_38,(string *)local_78,(size_t)_pos._M_p);
        if ((_pos._M_p < (pointer)0x2) || (remainder._M_dataplus._M_p != (pointer)0x1)) {
          std::__cxx11::string::substr((ulong)(remainder.field_2._M_local_buf + 8),(ulong)local_78);
          std::__cxx11::string::operator=
                    ((string *)local_78,(string *)(remainder.field_2._M_local_buf + 8));
          if ((long *)remainder.field_2._8_8_ != &stack0xffffffffffffffb8) {
            operator_delete((void *)remainder.field_2._8_8_,local_48 + 1);
          }
        }
        local_38 = _attr->indent;
      }
      else {
        sVar8 = std::__cxx11::string::find_last_of
                          ((char *)local_78,(ulong)local_f8,(ulong)_pos._M_p);
        if (sVar8 - 1 < 0xfffffffffffffffe) {
          spliceLine(this,local_38,(string *)local_78,sVar8);
          lVar12 = local_98;
          if (*(char *)local_78 == ' ') {
            std::__cxx11::string::substr
                      ((ulong)(remainder.field_2._M_local_buf + 8),(ulong)local_78);
            std::__cxx11::string::operator=
                      ((string *)local_78,(string *)(remainder.field_2._M_local_buf + 8));
            if ((long *)remainder.field_2._8_8_ != &stack0xffffffffffffffb8) {
              operator_delete((void *)remainder.field_2._8_8_,local_48 + 1);
            }
          }
        }
        else {
          spliceLine(this,local_38,(string *)local_78,(size_t)(_pos._M_p + -1));
          lVar12 = local_98;
          std::__cxx11::string::append
                    ((char *)((this->lines).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1));
        }
        if ((long)(this->lines).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->lines).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x20) {
          local_38 = _attr->indent;
        }
        lVar9 = 0;
        if (lVar12 != -1) {
          lVar9 = lVar12;
        }
        local_38 = local_38 + lVar9;
      }
    } while (remainder._M_dataplus._M_p != (pointer)0x0);
  }
  if (local_78 != (undefined1  [8])&remainder._M_string_length) {
    operator_delete((void *)local_78,remainder._M_string_length + 1);
  }
  if (local_f8 != &wrappableChars._M_string_length) {
    operator_delete(local_f8,wrappableChars._M_string_length + 1);
  }
  return;
}

Assistant:

Text( std::string const& _str, TextAttributes const& _attr = TextAttributes() )
        : attr( _attr )
        {
            std::string wrappableChars = " [({.,/|\\-";
            std::size_t indent = _attr.initialIndent != std::string::npos
                ? _attr.initialIndent
                : _attr.indent;
            std::string remainder = _str;

            while( !remainder.empty() ) {
                if( lines.size() >= 1000 ) {
                    lines.push_back( "... message truncated due to excessive size" );
                    return;
                }
                std::size_t tabPos = std::string::npos;
                std::size_t width = (std::min)( remainder.size(), _attr.width - indent );
                std::size_t pos = remainder.find_first_of( '\n' );
                if( pos <= width ) {
                    width = pos;
                }
                pos = remainder.find_last_of( _attr.tabChar, width );
                if( pos != std::string::npos ) {
                    tabPos = pos;
                    if( remainder[width] == '\n' )
                        width--;
                    remainder = remainder.substr( 0, tabPos ) + remainder.substr( tabPos+1 );
                }

                if( width == remainder.size() ) {
                    spliceLine( indent, remainder, width );
                }
                else if( remainder[width] == '\n' ) {
                    spliceLine( indent, remainder, width );
                    if( width <= 1 || remainder.size() != 1 )
                        remainder = remainder.substr( 1 );
                    indent = _attr.indent;
                }
                else {
                    pos = remainder.find_last_of( wrappableChars, width );
                    if( pos != std::string::npos && pos > 0 ) {
                        spliceLine( indent, remainder, pos );
                        if( remainder[0] == ' ' )
                            remainder = remainder.substr( 1 );
                    }
                    else {
                        spliceLine( indent, remainder, width-1 );
                        lines.back() += "-";
                    }
                    if( lines.size() == 1 )
                        indent = _attr.indent;
                    if( tabPos != std::string::npos )
                        indent += tabPos;
                }
            }
        }